

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O1

int LogLuvInitState(TIFF *tif)

{
  uint16_t uVar1;
  uint uVar2;
  uint8_t *puVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  tmsize_t tVar6;
  void *pvVar7;
  uint uVar8;
  undefined4 uVar9;
  ulong first;
  char *fmt;
  
  puVar3 = tif->tif_data;
  if (puVar3 == (uint8_t *)0x0) {
    __assert_fail("sp != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_luv.c"
                  ,0x5ac,"int LogLuvInitState(TIFF *)");
  }
  if ((tif->tif_dir).td_photometric != 0x804d) {
    __assert_fail("td->td_photometric == PHOTOMETRIC_LOGLUV",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_luv.c"
                  ,0x5ad,"int LogLuvInitState(TIFF *)");
  }
  if ((tif->tif_dir).td_planarconfig != 1) {
    fmt = "SGILog compression cannot handle non-contiguous data";
    goto LAB_002ac06e;
  }
  if (*(int *)(puVar3 + 4) == -1) {
    uVar8 = (uint)(tif->tif_dir).td_sampleformat | (uint)(tif->tif_dir).td_bitspersample << 3;
    uVar5 = 0xffffffff;
    uVar4 = 0xffffffff;
    if (uVar8 < 0x101) {
      if ((uVar8 - 0x81 < 4) && (uVar8 - 0x81 != 2)) {
        uVar9 = 1;
      }
      else {
        if ((uVar8 != 0x41) && (uVar8 != 0x44)) goto LAB_002abfaf;
        uVar9 = 3;
      }
    }
    else {
      if (1 < uVar8 - 0x101) {
        uVar9 = 0;
        if (uVar8 == 0x103) goto LAB_002abfc5;
        if (uVar8 != 0x104) goto LAB_002abfaf;
      }
      uVar4 = 2;
LAB_002abfaf:
      uVar5 = uVar4;
      uVar9 = 0xffffffff;
    }
LAB_002abfc5:
    uVar1 = (tif->tif_dir).td_samplesperpixel;
    if ((uVar1 != 1) && (uVar5 = uVar9, uVar1 != 3)) {
      uVar5 = 0xffffffff;
    }
    *(undefined4 *)(puVar3 + 4) = uVar5;
  }
  if ((ulong)*(uint *)(puVar3 + 4) < 4) {
    *(undefined4 *)(puVar3 + 0xc) =
         *(undefined4 *)(&DAT_003342f0 + (ulong)*(uint *)(puVar3 + 4) * 4);
    if ((tif->tif_flags & 0x400) == 0) {
      uVar8 = (tif->tif_dir).td_rowsperstrip;
      first = (ulong)(tif->tif_dir).td_imagewidth;
      uVar2 = (tif->tif_dir).td_imagelength;
      if (uVar2 <= uVar8) {
        uVar8 = uVar2;
      }
    }
    else {
      first = (ulong)(tif->tif_dir).td_tilewidth;
      uVar8 = (tif->tif_dir).td_tilelength;
    }
    tVar6 = _TIFFMultiplySSize((TIFF *)0x0,first,(ulong)uVar8,(char *)0x0);
    *(tmsize_t *)(puVar3 + 0x18) = tVar6;
    tVar6 = _TIFFMultiplySSize((TIFF *)0x0,*(tmsize_t *)(puVar3 + 0x18),4,(char *)0x0);
    fmt = "No space for SGILog translation buffer";
    if (tVar6 != 0) {
      pvVar7 = _TIFFmallocExt(tif,*(long *)(puVar3 + 0x18) << 2);
      *(void **)(puVar3 + 0x10) = pvVar7;
      if (pvVar7 != (void *)0x0) {
        return 1;
      }
    }
  }
  else {
    fmt = "No support for converting user data format to LogLuv";
  }
LAB_002ac06e:
  TIFFErrorExtR(tif,"LogLuvInitState",fmt);
  return 0;
}

Assistant:

static int LogLuvInitState(TIFF *tif)
{
    static const char module[] = "LogLuvInitState";
    TIFFDirectory *td = &tif->tif_dir;
    LogLuvState *sp = DecoderState(tif);

    assert(sp != NULL);
    assert(td->td_photometric == PHOTOMETRIC_LOGLUV);

    /* for some reason, we can't do this in TIFFInitLogLuv */
    if (td->td_planarconfig != PLANARCONFIG_CONTIG)
    {
        TIFFErrorExtR(tif, module,
                      "SGILog compression cannot handle non-contiguous data");
        return (0);
    }
    if (sp->user_datafmt == SGILOGDATAFMT_UNKNOWN)
        sp->user_datafmt = LogLuvGuessDataFmt(td);
    switch (sp->user_datafmt)
    {
        case SGILOGDATAFMT_FLOAT:
            sp->pixel_size = 3 * sizeof(float);
            break;
        case SGILOGDATAFMT_16BIT:
            sp->pixel_size = 3 * sizeof(int16_t);
            break;
        case SGILOGDATAFMT_RAW:
            sp->pixel_size = sizeof(uint32_t);
            break;
        case SGILOGDATAFMT_8BIT:
            sp->pixel_size = 3 * sizeof(uint8_t);
            break;
        default:
            TIFFErrorExtR(
                tif, module,
                "No support for converting user data format to LogLuv");
            return (0);
    }
    if (isTiled(tif))
        sp->tbuflen = multiply_ms(td->td_tilewidth, td->td_tilelength);
    else if (td->td_rowsperstrip < td->td_imagelength)
        sp->tbuflen = multiply_ms(td->td_imagewidth, td->td_rowsperstrip);
    else
        sp->tbuflen = multiply_ms(td->td_imagewidth, td->td_imagelength);
    if (multiply_ms(sp->tbuflen, sizeof(uint32_t)) == 0 ||
        (sp->tbuf = (uint8_t *)_TIFFmallocExt(
             tif, sp->tbuflen * sizeof(uint32_t))) == NULL)
    {
        TIFFErrorExtR(tif, module, "No space for SGILog translation buffer");
        return (0);
    }
    return (1);
}